

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

shared_ptr<pbrt::syntactic::Scene> pbrt::syntactic::Scene::parse(string *fileName,string *basePath)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<pbrt::syntactic::Scene> sVar1;
  shared_ptr<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>_> parser;
  BasicParser<pbrt::syntactic::MappedFile> *in_stack_00000050;
  BasicParser<pbrt::syntactic::MappedFile> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  std::
  make_shared<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>,std::__cxx11::string_const&>
            (in_stack_ffffffffffffffd8);
  std::
  __shared_ptr_access<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x195bbe);
  BasicParser<pbrt::syntactic::MappedFile>::parse(in_stack_00000050,fileName);
  std::
  __shared_ptr_access<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x195bd7);
  BasicParser<pbrt::syntactic::MappedFile>::getScene(in_stack_ffffffffffffffa8);
  std::shared_ptr<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>_>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>_> *)0x195bf0);
  sVar1.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<pbrt::syntactic::Scene>)
         sVar1.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Scene> Scene::parse(const std::string &fileName, const std::string &basePath)
    {
      std::shared_ptr<Parser> parser = std::make_shared<Parser>(basePath);
      parser->parse(fileName);
      return parser->getScene();
    }